

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
SortableOIDType::generateSortingMap
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          SortableOIDType *this)

{
  pointer puVar1;
  iterator __position;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  unsigned_long local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (__return_storage_ptr__,
             (long)(this->super_OIDType).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_OIDType).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  puVar1 = (this->super_OIDType).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = ~(uint)puVar1 +
          *(int *)&(this->super_OIDType).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (0 < iVar5) {
    pbVar8 = puVar1 + 1;
    do {
      bVar3 = *pbVar8;
      if ((char)bVar3 < '\0') {
        uVar7 = 1;
        uVar4 = 0;
        do {
          if ((iVar5 <= (int)uVar7) || (0x7ffffffe < (long)uVar4)) break;
          uVar4 = (uVar4 | bVar3 & 0x7f) << 7;
          bVar3 = pbVar8[uVar7];
          uVar7 = uVar7 + 1;
        } while ((char)bVar3 < '\0');
        uVar7 = uVar7 & 0xffffffff;
      }
      else {
        uVar7 = 1;
        uVar4 = 0;
      }
      local_30 = bVar3 + uVar4;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pbVar8 = pbVar8 + uVar7;
      iVar6 = iVar5 - (int)uVar7;
      bVar2 = (int)uVar7 <= iVar5;
      iVar5 = iVar6;
    } while (iVar6 != 0 && bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<unsigned long> SortableOIDType::generateSortingMap() const {
    auto map = std::vector<unsigned long>();

    // maybe anice midway between speed and size?
    map.reserve(this->data.size() * 1);

    const uint8_t* ptr = this->data.data();

    ptr += 1; // skip to start of interesting differences
    int i = this->data.size() - 1;

    while(i > 0){
        long item;
        size_t len = decode_ber_longform_integer(ptr, &item, i);
        ptr += len; i -= len;
        map.push_back(item);
    }

    return map;
}